

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  bool bVar1;
  reference pcVar2;
  ulong uVar3;
  char *pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_58;
  char character;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  string local_30 [8];
  string normalized_pathname;
  FilePath *this_local;
  
  normalized_pathname.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)local_30);
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_58._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffa8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    bVar1 = IsPathSeparator(*pcVar2);
    if (bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) != 0) || (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 != '/')) {
        std::__cxx11::string::push_back((char)local_30);
      }
    }
    else {
      std::__cxx11::string::push_back((char)local_30);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::operator=((string *)this,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void FilePath::Normalize() {
  std::string normalized_pathname;
  normalized_pathname.reserve(pathname_.length());

  for (const char character : pathname_) {
    if (!IsPathSeparator(character)) {
      normalized_pathname.push_back(character);
    } else if (normalized_pathname.empty() ||
               normalized_pathname.back() != kPathSeparator) {
      normalized_pathname.push_back(kPathSeparator);
    } else {
      continue;
    }
  }

  pathname_ = normalized_pathname;
}